

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O3

bool __thiscall json::SaveObject::process<unsigned_int>(SaveObject *this,char *name,uint *t)

{
  ostream *poVar1;
  size_t sVar2;
  int iVar3;
  char local_2b [3];
  
  if (this->first == true) {
    this->first = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(this->out,",\n",2);
  }
  if (0 < this->tabs) {
    iVar3 = 0;
    do {
      local_2b[0] = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(this->out,local_2b,1);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->tabs);
  }
  local_2b[1] = 0x22;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->out,local_2b + 1,1);
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,name,sVar2);
  }
  local_2b[2] = 0x22;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2b + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)this->out);
  return ((byte)this->out[*(long *)(*(long *)this->out + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool process(const char* name, T& t) {
		if (first)
			first = false;
		else
			out << ",\n";
		for (int i = 0; i < tabs; ++i) out << '\t';
		out << quote << name << quote << ": ";
		save(out, t, tabs);
		if (out.fail())
			return false;
		return true;
	}